

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O2

StringTree * __thiscall
capnp::compiler::stringLiteralStringTree
          (StringTree *__return_storage_ptr__,compiler *this,StringPtr chars)

{
  char *in_R8;
  ArrayPtr<const_char> text;
  undefined1 local_3a;
  kj local_39;
  Array<char> local_38;
  
  local_39 = (kj)0x22;
  text.size_ = chars.content.ptr + -1;
  text.ptr = (char *)this;
  kj::encodeCEscape((String *)&local_38,text);
  local_3a = 0x22;
  kj::strTree<char,kj::String,char>
            (__return_storage_ptr__,&local_39,(char *)&local_38,(String *)&local_3a,in_R8);
  kj::Array<char>::~Array(&local_38);
  return __return_storage_ptr__;
}

Assistant:

static kj::StringTree stringLiteralStringTree(kj::StringPtr chars) {
  return kj::strTree('"', kj::encodeCEscape(chars), '"');
}